

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  wchar_t *pwVar1;
  wchar_t *in_RSI;
  unsigned_long in_stack_ffffffffffffffe8;
  
  pwVar1 = internal::format_decimal<wchar_t*,unsigned_long>(in_RSI,in_stack_ffffffffffffffe8,0);
  *(wchar_t **)in_RSI = pwVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal(it, abs_value, num_digits);
      }